

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,char *s)

{
  uchar *__dest;
  size_t sVar1;
  CBStringException *pCVar2;
  ulong uVar3;
  char *__s;
  CBStringException bstr__cppwrapper_exception;
  CBStringException CStack_a8;
  string local_80;
  string local_60;
  string local_40;
  
  uVar3 = (ulong)(this->super_tagbstring).mlen;
  if ((long)uVar3 < 1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_a8,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_a8);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  __s = anon_var_dwarf_3510d + 0x10;
  if (s != (char *)0x0) {
    __s = s;
  }
  sVar1 = strlen(__s);
  if (uVar3 <= sVar1) {
    if (0x7ffffffd < sVar1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "CBString::Failure in =(const char *) operator, string too large","");
      CBStringException::CBStringException(&CStack_a8,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&CStack_a8);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    alloc(this,(int)sVar1);
  }
  __dest = (this->super_tagbstring).data;
  if (__dest != (uchar *)0x0) {
    (this->super_tagbstring).slen = (int)sVar1;
    memcpy(__dest,__s,sVar1 + 1);
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CBString::Failure in =(const char *) operator","");
  CBStringException::CBStringException(&CStack_a8,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&CStack_a8);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const char *s) {
size_t tmpSlen;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s) s = "";
	if ((tmpSlen = strlen (s)) >= (size_t) mlen) {
		if (tmpSlen >= INT_MAX-1) bstringThrow ("Failure in =(const char *) operator, string too large");
		alloc ((int) tmpSlen);
	}

	if (data) {
		slen = (int) tmpSlen;
		bstr__memcpy (data, s, tmpSlen + 1);
	} else {
		mlen = slen = 0;
		bstringThrow ("Failure in =(const char *) operator");
	}
	return *this;
}